

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O3

void __thiscall Jinx::Impl::BinaryWriter::Write(BinaryWriter *this,void *val,size_t bytes)

{
  element_type *peVar1;
  ulong __args_2;
  uint8_t *__args;
  ulong uVar2;
  ulong __args_1;
  
  peVar1 = (this->m_buffer).super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar2 = this->m_pos;
  if (peVar1->m_size < uVar2) {
    __assert_fail("*pos <= m_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Tests/UnitTests/../../Include/Jinx.hpp"
                  ,0xb6f,"void Jinx::Buffer::Write(size_t *, const void *, size_t)");
  }
  if ((val != (void *)0x0) && (bytes != 0)) {
    __args_2 = peVar1->m_capacity;
    if (__args_2 < uVar2 + bytes) {
      __args_1 = (__args_2 >> 1) + __args_2 + bytes;
      __args = peVar1->m_data;
      if (__args_2 <= __args_1 && __args_1 - __args_2 != 0) {
        if (__args != (uint8_t *)0x0) {
          LOCK();
          Mem::freeCount.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)
               ((long)Mem::freeCount.super___atomic_base<unsigned_long>._M_i + 1);
          UNLOCK();
        }
        LOCK();
        Mem::allocationCount.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)
             ((long)Mem::allocationCount.super___atomic_base<unsigned_long>._M_i + 1);
        UNLOCK();
        LOCK();
        Mem::allocatedMemory.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)
             ((long)Mem::allocatedMemory.super___atomic_base<unsigned_long>._M_i +
             (__args_1 - __args_2));
        UNLOCK();
        __args = (uint8_t *)
                 std::function<void_*(void_*,_unsigned_long,_unsigned_long)>::operator()
                           (&Mem::reallocFn,__args,__args_1,__args_2);
        peVar1->m_data = __args;
        peVar1->m_capacity = __args_1;
        uVar2 = this->m_pos;
      }
    }
    else {
      __args = peVar1->m_data;
    }
    memcpy(__args + uVar2,val,bytes);
    uVar2 = bytes + this->m_pos;
    this->m_pos = uVar2;
    if (peVar1->m_size < uVar2) {
      peVar1->m_size = uVar2;
    }
    return;
  }
  __assert_fail("data && bytes",
                "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Tests/UnitTests/../../Include/Jinx.hpp"
                ,0xb70,"void Jinx::Buffer::Write(size_t *, const void *, size_t)");
}

Assistant:

void Write(const void * val, size_t bytes) { m_buffer->Write(&m_pos, val, bytes); }